

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

BOOL Js::JavascriptObject::ChangePrototype
               (RecyclableObject *object,RecyclableObject *newPrototype,bool shouldThrow,
               ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  JavascriptProxy *this;
  RecyclableObject *pRVar7;
  DynamicObject *pDVar8;
  ScriptContext *scriptContext_00;
  int32 hCode;
  Type TVar9;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> local_50;
  RecyclableObject *local_48;
  undefined4 *local_40;
  char local_31 [8];
  bool allProtoCachesInvalidated;
  
  BVar4 = JavascriptOperators::IsObject(object);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0xac,"(JavascriptOperators::IsObject(object))",
                                "JavascriptOperators::IsObject(object)");
    if (!bVar3) goto LAB_00b8f05b;
    *puVar6 = 0;
  }
  BVar4 = JavascriptOperators::IsObjectOrNull(newPrototype);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0xad,"(JavascriptOperators::IsObjectOrNull(newPrototype))",
                                "JavascriptOperators::IsObjectOrNull(newPrototype)");
    if (!bVar3) goto LAB_00b8f05b;
    *puVar6 = 0;
  }
  bVar3 = VarIsImpl<Js::JavascriptProxy>(object);
  if (bVar3) {
    this = VarTo<Js::JavascriptProxy,Js::RecyclableObject>(object);
    CrossSite::ForceCrossSiteThunkOnPrototypeChain(newPrototype);
    BVar4 = JavascriptProxy::SetPrototypeTrap(this,newPrototype,shouldThrow,scriptContext);
    return BVar4;
  }
  pRVar7 = (RecyclableObject *)GetPrototypeOf(object,scriptContext);
  if (pRVar7 == newPrototype) {
    return 1;
  }
  iVar5 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x33])(object);
  if (iVar5 == 0) {
    if (!shouldThrow) {
      return 0;
    }
    hCode = -0x7ff5ec4a;
LAB_00b8eceb:
    JavascriptError::ThrowTypeError(scriptContext,hCode,(PCWSTR)0x0);
  }
  iVar5 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x34])(object);
  if (iVar5 != 0) {
    hCode = -0x7ff5ebe3;
    goto LAB_00b8eceb;
  }
  bVar3 = IsPrototypeOfStopAtProxy(object,newPrototype,scriptContext_00);
  if (bVar3) {
    if (!shouldThrow) {
      return 0;
    }
    hCode = -0x7ff5ec50;
    goto LAB_00b8eceb;
  }
  pDVar8 = VarTo<Js::DynamicObject,Js::RecyclableObject>(object);
  if ((*(byte *)(*(long *)((pDVar8->super_RecyclableObject).type.ptr + 1) + 9) & 0x20) != 0) {
    local_31[0] = '\0';
    if (newPrototype == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00b8f05b;
      *puVar6 = 0;
    }
    TVar9 = ((newPrototype->type).ptr)->typeId;
    if ((0x57 < (int)TVar9) && (BVar4 = RecyclableObject::IsExternal(newPrototype), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00b8f05b;
      *puVar6 = 0;
    }
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    pRVar7 = newPrototype;
    local_48 = object;
    while ((TVar9 != TypeIds_Null && (TVar9 != TypeIds_Proxy))) {
      (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x4c])(pRVar7);
      pRVar7 = RecyclableObject::GetPrototype(pRVar7);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = local_40;
        *local_40 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00b8f05b;
        *puVar6 = 0;
      }
      TVar9 = ((pRVar7->type).ptr)->typeId;
      if ((0x57 < (int)TVar9) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = local_40;
        *local_40 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00b8f05b;
        *puVar6 = 0;
        object = local_48;
      }
    }
    pRVar7 = RecyclableObject::GetPrototype(object);
    if (pRVar7 != (RecyclableObject *)0x0) goto LAB_00b8ed02;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *local_40 = 1;
    while (puVar6 = local_40,
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null"), bVar3) {
      *puVar6 = 0;
LAB_00b8ed02:
      do {
        TVar9 = ((pRVar7->type).ptr)->typeId;
        if ((0x57 < (int)TVar9) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_40 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) goto LAB_00b8f05b;
          *local_40 = 0;
        }
        if (((TVar9 == TypeIds_Null) || (TVar9 == TypeIds_Proxy)) ||
           ((*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x49])(pRVar7,scriptContext,local_31),
           local_31[0] != '\0')) {
          bVar3 = JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties
                            (newPrototype);
          pJVar1 = (((object->type).ptr)->javascriptLibrary).ptr;
          if ((!bVar3) ||
             ((pJVar1->super_JavascriptLibraryBase).scriptContext.ptr !=
              (((((newPrototype->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
              scriptContext.ptr)) {
            Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
            WriteBarrierSet(&local_50,&pJVar1->typesWithNoSpecialPropertyProtoChain);
            PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(local_50.ptr);
          }
          bVar3 = JavascriptOperators::CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties
                            (newPrototype);
          pJVar1 = (((object->type).ptr)->javascriptLibrary).ptr;
          if ((!bVar3) ||
             ((pJVar1->super_JavascriptLibraryBase).scriptContext.ptr !=
              (((((newPrototype->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
              scriptContext.ptr)) {
            Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
            WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                             *)&local_50,&pJVar1->typesWithOnlyWritablePropertyProtoChain);
            PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                      ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)local_50.ptr);
          }
          if (local_31[0] != '\0') goto LAB_00b8ee6c;
          if (newPrototype == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = local_40;
            *local_40 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar3) goto LAB_00b8f05b;
            *puVar6 = 0;
          }
          TVar9 = ((newPrototype->type).ptr)->typeId;
          pRVar7 = newPrototype;
          if ((0x57 < (int)TVar9) &&
             (BVar4 = RecyclableObject::IsExternal(newPrototype), BVar4 == 0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_40 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            goto LAB_00b8f05d;
          }
          goto LAB_00b8f068;
        }
        pRVar7 = RecyclableObject::GetPrototype(pRVar7);
      } while (pRVar7 != (RecyclableObject *)0x0);
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *local_40 = 1;
    }
LAB_00b8f05b:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  bVar3 = DynamicObject::HasLockedType(pDVar8);
  if (!bVar3) {
    DynamicObject::ChangeType(pDVar8);
  }
  bVar3 = ThreadContext::IsObjectRegisteredInProtoInlineCaches
                    (((((((pDVar8->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr)->threadContext,pDVar8);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0xf3,
                                "(!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInProtoInlineCaches(obj))"
                                ,
                                "!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInProtoInlineCaches(obj)"
                               );
    if (!bVar3) goto LAB_00b8f05b;
    *puVar6 = 0;
  }
  bVar3 = ThreadContext::IsObjectRegisteredInStoreFieldInlineCaches
                    (((((((pDVar8->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr)->threadContext,pDVar8);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0xf4,
                                "(!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInStoreFieldInlineCaches(obj))"
                                ,
                                "!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInStoreFieldInlineCaches(obj)"
                               );
    if (!bVar3) goto LAB_00b8f05b;
    *puVar6 = 0;
  }
LAB_00b8ea65:
  BVar4 = RecyclableObject::IsExternal(object);
  if (BVar4 == 0) {
    bVar3 = DynamicType::Is(((object->type).ptr)->typeId);
    if (!bVar3) goto LAB_00b8ecb6;
    pDVar8 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    iVar5 = (*(pDVar8->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x66])(pDVar8);
    if (iVar5 == 0) goto LAB_00b8ecb6;
  }
  CrossSite::ForceCrossSiteThunkOnPrototypeChain(newPrototype);
LAB_00b8ecb6:
  (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
    [0x4b])(object,newPrototype);
  return 1;
LAB_00b8f068:
  if (((TVar9 == TypeIds_Null) || (TVar9 == TypeIds_Proxy)) ||
     ((*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x4a])(pRVar7,scriptContext,local_31), local_31[0] != '\0')) goto LAB_00b8ee6c;
  pRVar7 = RecyclableObject::GetPrototype(pRVar7);
  if (pRVar7 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = local_40;
    *local_40 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00b8f05b;
    *puVar6 = 0;
  }
  TVar9 = ((pRVar7->type).ptr)->typeId;
  if ((0x57 < (int)TVar9) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *local_40 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
LAB_00b8f05d:
    if (bVar3 == false) goto LAB_00b8f05b;
    *local_40 = 0;
  }
  goto LAB_00b8f068;
LAB_00b8ee6c:
  pRVar7 = RecyclableObject::GetPrototype(object);
  if (pRVar7 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = local_40;
    *local_40 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00b8f05b;
    *puVar6 = 0;
  }
  TVar9 = ((pRVar7->type).ptr)->typeId;
  if ((int)TVar9 < 0x58) goto LAB_00b8efc9;
  iVar5 = RecyclableObject::IsExternal(pRVar7);
  do {
    if (iVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = local_40;
      *local_40 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00b8f05b;
      *puVar6 = 0;
    }
LAB_00b8efc9:
    do {
      if (((TVar9 == TypeIds_Null) || (TVar9 == TypeIds_Proxy)) ||
         (iVar5 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x4c])(pRVar7), (char)iVar5 != '\0'))
      goto LAB_00b8ea65;
      pRVar7 = RecyclableObject::GetPrototype(pRVar7);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = local_40;
        *local_40 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00b8f05b;
        *puVar6 = 0;
      }
      TVar9 = ((pRVar7->type).ptr)->typeId;
    } while ((int)TVar9 < 0x58);
    iVar5 = RecyclableObject::IsExternal(pRVar7);
  } while( true );
}

Assistant:

BOOL JavascriptObject::ChangePrototype(RecyclableObject* object, RecyclableObject* newPrototype, bool shouldThrow, ScriptContext* scriptContext)
{
    // 8.3.2    [[SetInheritance]] (V)
    // When the [[SetInheritance]] internal method of O is called with argument V the following steps are taken:
    // 1.   Assert: Either Type(V) is Object or Type(V) is Null.
    Assert(JavascriptOperators::IsObject(object));
    Assert(JavascriptOperators::IsObjectOrNull(newPrototype));

    if (VarIs<JavascriptProxy>(object))
    {
        JavascriptProxy* proxy = VarTo<JavascriptProxy>(object);
        CrossSite::ForceCrossSiteThunkOnPrototypeChain(newPrototype);
        return proxy->SetPrototypeTrap(newPrototype, shouldThrow, scriptContext);
    }

    // 2.   Let extensible be the value of the [[Extensible]] internal data property of O.
    // 3.   Let current be the value of the [[Prototype]] internal data property of O.
    // 4.   If SameValue(V, current), then return true.
    if (newPrototype == JavascriptObject::GetPrototypeOf(object, scriptContext))
    {
        return TRUE;
    }

    // 5.   If extensible is false, then return false.
    if (!object->IsExtensible())
    {
        if (shouldThrow)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NonExtensibleObject);
        }
        return FALSE;
    }

    if (object->IsProtoImmutable())
    {
        // ES2016 19.1.3:
        // The Object prototype object is the intrinsic object %ObjectPrototype%.
        // The Object prototype object is an immutable prototype exotic object.
        // ES2016 9.4.7:
        // An immutable prototype exotic object is an exotic object that has an immutable [[Prototype]] internal slot.
        JavascriptError::ThrowTypeError(scriptContext, JSERR_ImmutablePrototypeSlot);
    }

    // 6.   If V is not null, then
    //  a.  Let p be V.
    //  b.  Repeat, while p is not null
    //      i.  If SameValue(p, O) is true, then return false.
    //      ii. Let nextp be the result of calling the [[GetInheritance]] internal method of p with no arguments.
    //      iii.    ReturnIfAbrupt(nextp).
    //      iv. Let  p be nextp.
    if (IsPrototypeOfStopAtProxy(object, newPrototype, scriptContext)) // Reject cycle
    {
        if (shouldThrow)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_CyclicProtoValue);
        }
        return FALSE;
    }

    // 7.   Set the value of the [[Prototype]] internal data property of O to V.
    // 8.   Return true.

    bool isInvalidationOfInlineCacheNeeded = true;
    DynamicObject * obj = VarTo<DynamicObject>(object);

    // If this object was not prototype object, then no need to invalidate inline caches.
    // Simply assign it a new type so if this object used protoInlineCache in past, it will
    // be invalidated because of type mismatch and subsequently we will update its protoInlineCache
    if (!(obj->GetDynamicType()->GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag))
    {
        // If object has locked type, skip changing its type here as it will be changed anyway below
        // when object gets newPrototype object.
        if (!obj->HasLockedType())
        {
            obj->ChangeType();
        }
        Assert(!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInProtoInlineCaches(obj));
        Assert(!obj->GetScriptContext()->GetThreadContext()->IsObjectRegisteredInStoreFieldInlineCaches(obj));
        isInvalidationOfInlineCacheNeeded = false;
    }

    if (isInvalidationOfInlineCacheNeeded)
    {
        bool allProtoCachesInvalidated = false;

        JavascriptOperators::MapObjectAndPrototypes<true>(newPrototype, [&](RecyclableObject* obj)
        {
            obj->ClearProtoCachesWereInvalidated();
        });

        // Notify old prototypes that they are being removed from a prototype chain. This triggers invalidating protocache, etc.
        JavascriptOperators::MapObjectAndPrototypesUntil<true>(object->GetPrototype(), [&](RecyclableObject* obj)->bool
        {
            obj->RemoveFromPrototype(scriptContext, &allProtoCachesInvalidated);
            return allProtoCachesInvalidated;
        });

        // Examine new prototype chain. If it brings in any special property, we need to invalidate related caches.
        bool objectAndPrototypeChainHasNoSpecialProperties =
            JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(newPrototype);

        if (!objectAndPrototypeChainHasNoSpecialProperties
            || object->GetScriptContext() != newPrototype->GetScriptContext())
        {
            // The HaveNoSpecialProperties cache is cleared when a property is added or changed,
            // but only for types in the same script context. Therefore, if the prototype is in another
            // context, the object's cache won't be cleared when a property is added or changed on the prototype.
            // Moreover, an object is added to the cache only when its whole prototype chain is in the same
            // context.
            //
            // Since we don't have a way to find out which objects have a certain object as their prototype,
            // we clear the cache here instead.
            object->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
        }

        // Examine new prototype chain. If it brings in any non-WritableData property, we need to invalidate related caches.
        bool objectAndPrototypeChainHasOnlyWritableDataProperties =
            JavascriptOperators::CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties(newPrototype);

        if (!objectAndPrototypeChainHasOnlyWritableDataProperties
            || object->GetScriptContext() != newPrototype->GetScriptContext())
        {
            // The HaveOnlyWritableDataProperties cache is cleared when a property is added or changed,
            // but only for types in the same script context. Therefore, if the prototype is in another
            // context, the object's cache won't be cleared when a property is added or changed on the prototype.
            // Moreover, an object is added to the cache only when its whole prototype chain is in the same
            // context.
            //
            // Since we don't have a way to find out which objects have a certain object as their prototype,
            // we clear the cache here instead.

            // Invalidate fast prototype chain writable data test flag
            object->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }

        if (!allProtoCachesInvalidated)
        {
            // Invalidate StoreField/PropertyGuards for any non-WritableData property in the new chain
            JavascriptOperators::MapObjectAndPrototypesUntil<true>(newPrototype, [&](RecyclableObject* obj)->bool
            {
                obj->AddToPrototype(scriptContext, &allProtoCachesInvalidated);
                return allProtoCachesInvalidated;
            });
        }

        JavascriptOperators::MapObjectAndPrototypesUntil<true>(object->GetPrototype(), [](RecyclableObject* obj)->bool
        {
            return obj->ClearProtoCachesWereInvalidated();
        });
    }

    // Set to new prototype
    if (object->IsExternal() || (DynamicType::Is(object->GetTypeId()) && (UnsafeVarTo<DynamicObject>(object))->IsCrossSiteObject()))
    {
        CrossSite::ForceCrossSiteThunkOnPrototypeChain(newPrototype);
    }
    object->SetPrototype(newPrototype);
    return TRUE;
}